

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O0

int ASN1_item_ex_new(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  long *plVar1;
  int iVar2;
  ASN1_VALUE *pAVar3;
  ASN1_VALUE **pval_00;
  code *local_78;
  code *local_70;
  ASN1_aux_cb *asn1_cb_1;
  ASN1_AUX *aux_1;
  ASN1_aux_cb *asn1_cb;
  ASN1_AUX *aux;
  int i;
  ASN1_VALUE **pseqval;
  ASN1_EXTERN_FUNCS *ef;
  ASN1_TEMPLATE *tt;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  switch(it->itype) {
  case '\0':
    if (it->utype == 0) {
      iVar2 = ASN1_primitive_new(pval,it);
    }
    else {
      iVar2 = ASN1_template_new(pval,(ASN1_TEMPLATE *)it->utype);
    }
    break;
  case '\x01':
    if (it->tcount == 0) {
      local_78 = (code *)0x0;
    }
    else {
      local_78 = *(code **)(it->tcount + 0x10);
    }
    if (local_78 != (code *)0x0) {
      iVar2 = (*local_78)(0,pval,it,0);
      if (iVar2 == 0) goto LAB_004964de;
      if (iVar2 == 2) {
        return 1;
      }
    }
    pAVar3 = (ASN1_VALUE *)OPENSSL_zalloc((size_t)it->funcs);
    *pval = pAVar3;
    if (*pval == (ASN1_VALUE *)0x0) {
      return 0;
    }
    asn1_refcount_set_one((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
    asn1_enc_init(pval,it);
    aux._4_4_ = 0;
    ef = (ASN1_EXTERN_FUNCS *)it->utype;
    for (; (long)aux._4_4_ < (long)it->templates; aux._4_4_ = aux._4_4_ + 1) {
      pval_00 = asn1_get_field_ptr(pval,(ASN1_TEMPLATE *)ef);
      iVar2 = ASN1_template_new(pval_00,(ASN1_TEMPLATE *)ef);
      if (iVar2 == 0) {
        ASN1_item_ex_free(pval,it);
        return 0;
      }
      ef = ef + 1;
    }
    if (local_78 == (code *)0x0) {
      return 1;
    }
    iVar2 = (*local_78)(1,pval,it,0);
    goto joined_r0x00496376;
  case '\x02':
    if (it->tcount == 0) {
      local_70 = (code *)0x0;
    }
    else {
      local_70 = *(code **)(it->tcount + 0x10);
    }
    if (local_70 != (code *)0x0) {
      iVar2 = (*local_70)(0,pval,it,0);
      if (iVar2 == 0) goto LAB_004964de;
      if (iVar2 == 2) {
        return 1;
      }
    }
    pAVar3 = (ASN1_VALUE *)OPENSSL_zalloc((size_t)it->funcs);
    *pval = pAVar3;
    if (*pval == (ASN1_VALUE *)0x0) {
      return 0;
    }
    asn1_set_choice_selector(pval,-1,it);
    if (local_70 == (code *)0x0) {
      return 1;
    }
    iVar2 = (*local_70)(1,pval,it,0);
joined_r0x00496376:
    if (iVar2 != 0) {
      return 1;
    }
    ASN1_item_ex_free(pval,it);
LAB_004964de:
    ERR_put_error(0xc,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_new.cc"
                  ,0x8b);
    return 0;
  default:
    goto LAB_00496503;
  case '\x04':
    plVar1 = (long *)it->tcount;
    if (plVar1 == (long *)0x0) {
      return 1;
    }
    if (*plVar1 == 0) {
      return 1;
    }
    iVar2 = (*(code *)*plVar1)(pval,it);
    break;
  case '\x05':
    iVar2 = ASN1_primitive_new(pval,it);
  }
  if (iVar2 == 0) {
    return 0;
  }
LAB_00496503:
  return 1;
}

Assistant:

int ASN1_item_ex_new(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  const ASN1_TEMPLATE *tt = NULL;
  const ASN1_EXTERN_FUNCS *ef;
  ASN1_VALUE **pseqval;
  int i;

  switch (it->itype) {
    case ASN1_ITYPE_EXTERN:
      ef = reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      if (ef && ef->asn1_ex_new) {
        if (!ef->asn1_ex_new(pval, it)) {
          goto memerr;
        }
      }
      break;

    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        if (!ASN1_template_new(pval, it->templates)) {
          goto memerr;
        }
      } else if (!ASN1_primitive_new(pval, it)) {
        goto memerr;
      }
      break;

    case ASN1_ITYPE_MSTRING:
      if (!ASN1_primitive_new(pval, it)) {
        goto memerr;
      }
      break;

    case ASN1_ITYPE_CHOICE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
        if (!i) {
          goto auxerr;
        }
        if (i == 2) {
          return 1;
        }
      }
      *pval = reinterpret_cast<ASN1_VALUE *>(OPENSSL_zalloc(it->size));
      if (!*pval) {
        goto memerr;
      }
      asn1_set_choice_selector(pval, -1, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL)) {
        goto auxerr2;
      }
      break;
    }

    case ASN1_ITYPE_SEQUENCE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
        if (!i) {
          goto auxerr;
        }
        if (i == 2) {
          return 1;
        }
      }
      *pval = reinterpret_cast<ASN1_VALUE *>(OPENSSL_zalloc(it->size));
      if (!*pval) {
        goto memerr;
      }
      asn1_refcount_set_one(pval, it);
      asn1_enc_init(pval, it);
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        pseqval = asn1_get_field_ptr(pval, tt);
        if (!ASN1_template_new(pseqval, tt)) {
          goto memerr2;
        }
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL)) {
        goto auxerr2;
      }
      break;
    }
  }
  return 1;

memerr2:
  ASN1_item_ex_free(pval, it);
memerr:
  return 0;

auxerr2:
  ASN1_item_ex_free(pval, it);
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
  return 0;
}